

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall
Refal2::CInternalProgramBuilder::processModules
          (CInternalProgramBuilder *this,CModuleDataVector *modules,
          TProcessFunctionPtr processFunction)

{
  CModuleData *pCVar1;
  code *pcVar2;
  long in_RCX;
  pointer puVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  
  puVar3 = (modules->
           super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (modules->
                super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    plVar7 = (long *)((long)&this->errors + in_RCX);
    iVar4 = 0;
    do {
      pCVar1 = (puVar3->_M_t).
               super___uniq_ptr_impl<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>
               ._M_t.
               super__Tuple_impl<0UL,_Refal2::CModuleData_*,_std::default_delete<Refal2::CModuleData>_>
               .super__Head_base<0UL,_Refal2::CModuleData_*,_false>._M_head_impl;
      if (0 < (pCVar1->Functions).size) {
        lVar6 = 8;
        lVar5 = 0;
        do {
          pcVar2 = (code *)processFunction;
          if ((processFunction & 1) != 0) {
            pcVar2 = *(code **)(*plVar7 + -1 + processFunction);
          }
          (*pcVar2)(plVar7,*(undefined8 *)
                            ((long)&(((pCVar1->Functions).keyDataPairs)->key)._M_node + lVar6),iVar4
                   );
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
        } while (lVar5 < (pCVar1->Functions).size);
      }
      iVar4 = iVar4 + 1;
      puVar3 = puVar3 + 1;
    } while (puVar3 != (modules->
                       super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void CInternalProgramBuilder::processModules( const CModuleDataVector& modules,
	const TProcessFunctionPtr processFunction )
{
	TRuntimeModuleId currentModuleId = 0;
	for( CModuleDataVector::const_iterator module = modules.begin();
		module != modules.end(); ++module )
	{
		const CPreparatoryFunctions& functions = ( *module )->Functions;
		for( int i = 0; i < functions.Size(); i++ ) {
			( this->*processFunction )( functions.GetData( i ).get(),
				currentModuleId );
		}
		currentModuleId++;
	}
}